

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

void snga_select_elem(Integer type,char *op,void *ptr,Integer elems,elem_info_t *info,Integer *ind)

{
  DoublePrecision *pDVar1;
  float fVar2;
  long lVar3;
  double dVar4;
  DoublePrecision DVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  
  switch(type) {
  case 0x3e9:
    iVar7 = *ptr;
    iVar6 = strncmp(op,"min",3);
    if (iVar6 == 0) {
      if (0 < elems) {
        lVar8 = 0;
        do {
          iVar6 = *(int *)((long)ptr + lVar8 * 4);
          if (iVar6 < iVar7) {
            *ind = lVar8;
            iVar7 = iVar6;
          }
          lVar8 = lVar8 + 1;
        } while (elems != lVar8);
      }
    }
    else if (0 < elems) {
      lVar8 = 0;
      do {
        iVar6 = *(int *)((long)ptr + lVar8 * 4);
        if (iVar7 < iVar6) {
          *ind = lVar8;
          iVar7 = iVar6;
        }
        lVar8 = lVar8 + 1;
      } while (elems != lVar8);
    }
    (info->v).ival = iVar7;
    break;
  case 0x3ea:
    lVar8 = *ptr;
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          lVar3 = *(long *)((long)ptr + lVar9 * 8);
          if (lVar3 < lVar8) {
            *ind = lVar9;
            lVar8 = lVar3;
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        lVar3 = *(long *)((long)ptr + lVar9 * 8);
        if (lVar8 < lVar3) {
          *ind = lVar9;
          lVar8 = lVar3;
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
    goto LAB_0013eb0d;
  case 0x3eb:
    fVar12 = *ptr;
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar8 = 0;
        do {
          fVar11 = *(float *)((long)ptr + lVar8 * 4);
          if (fVar11 < fVar12) {
            *ind = lVar8;
            fVar12 = fVar11;
          }
          lVar8 = lVar8 + 1;
        } while (elems != lVar8);
      }
    }
    else if (0 < elems) {
      lVar8 = 0;
      do {
        fVar11 = *(float *)((long)ptr + lVar8 * 4);
        if (fVar12 < fVar11) {
          *ind = lVar8;
          fVar12 = fVar11;
        }
        lVar8 = lVar8 + 1;
      } while (elems != lVar8);
    }
    (info->v).fval = fVar12;
    break;
  case 0x3ec:
    dVar13 = *ptr;
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar8 = 0;
        do {
          dVar4 = *(double *)((long)ptr + lVar8 * 8);
          if (dVar4 < dVar13) {
            *ind = lVar8;
            dVar13 = dVar4;
          }
          lVar8 = lVar8 + 1;
        } while (elems != lVar8);
      }
    }
    else if (0 < elems) {
      lVar8 = 0;
      do {
        dVar4 = *(double *)((long)ptr + lVar8 * 8);
        if (dVar13 < dVar4) {
          *ind = lVar8;
          dVar13 = dVar4;
        }
        lVar8 = lVar8 + 1;
      } while (elems != lVar8);
    }
    (info->v).dval = dVar13;
    break;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    fVar12 = *ptr * *ptr + *(float *)((long)ptr + 4) * *(float *)((long)ptr + 4);
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar8 = 0;
        do {
          fVar11 = *(float *)((long)ptr + lVar8 * 8);
          fVar2 = *(float *)((long)ptr + lVar8 * 8 + 4);
          fVar11 = fVar11 * fVar11 + fVar2 * fVar2;
          if (fVar11 < fVar12) {
            *ind = lVar8;
            fVar12 = fVar11;
          }
          lVar8 = lVar8 + 1;
        } while (elems != lVar8);
      }
    }
    else if (0 < elems) {
      lVar8 = 0;
      do {
        fVar11 = *(float *)((long)ptr + lVar8 * 8);
        fVar2 = *(float *)((long)ptr + lVar8 * 8 + 4);
        fVar11 = fVar11 * fVar11 + fVar2 * fVar2;
        if (fVar12 < fVar11) {
          *ind = lVar8;
          fVar12 = fVar11;
        }
        lVar8 = lVar8 + 1;
      } while (elems != lVar8);
    }
    (info->v).fval = fVar12;
    info->extra2 = *(SingleComplex *)((long)ptr + *ind * 8);
    break;
  case 0x3ef:
    dVar13 = *ptr * *ptr + *(double *)((long)ptr + 8) * *(double *)((long)ptr + 8);
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar8 = 0;
        pdVar10 = (double *)ptr;
        do {
          dVar4 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
          if (dVar4 < dVar13) {
            *ind = lVar8;
            dVar13 = dVar4;
          }
          lVar8 = lVar8 + 1;
          pdVar10 = pdVar10 + 2;
        } while (elems != lVar8);
      }
    }
    else if (0 < elems) {
      lVar8 = 0;
      pdVar10 = (double *)ptr;
      do {
        dVar4 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
        if (dVar13 < dVar4) {
          *ind = lVar8;
          dVar13 = dVar4;
        }
        lVar8 = lVar8 + 1;
        pdVar10 = pdVar10 + 2;
      } while (elems != lVar8);
    }
    (info->v).dval = dVar13;
    pDVar1 = (DoublePrecision *)((long)ptr + *ind * 0x10);
    DVar5 = pDVar1[1];
    (info->extra).real = *pDVar1;
    (info->extra).imag = DVar5;
    break;
  case 0x3f8:
    lVar8 = *ptr;
    iVar7 = strncmp(op,"min",3);
    if (iVar7 == 0) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          lVar3 = *(long *)((long)ptr + lVar9 * 8);
          if (lVar3 < lVar8) {
            *ind = lVar9;
            lVar8 = lVar3;
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        lVar3 = *(long *)((long)ptr + lVar9 * 8);
        if (lVar8 < lVar3) {
          *ind = lVar9;
          lVar8 = lVar3;
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
LAB_0013eb0d:
    (info->v).lval = lVar8;
  }
  return;
}

Assistant:

static void snga_select_elem(Integer type, char* op, void *ptr, Integer elems, elem_info_t *info,
                      Integer *ind)
{
  Integer i;
  switch (type){
    int *ia,ival;
    double *da,dval;
    DoubleComplex *ca;
    SingleComplex *cfa;
    float *fa,fval;
    long *la,lval;
    long long *lla,llval;

    case C_INT:
    ia = (int*)ptr;
    ival = *ia;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(ival > ia[i]) {ival=ia[i];*ind=i; } } 
    else
      for(i=0;i<elems;i++){ if(ival < ia[i]) {ival=ia[i];*ind=i; } }

    info->v.ival = (int) ival;
    break;

    case C_DCPL:
    ca = (DoubleComplex*)ptr;
    dval=ca->real*ca->real + ca->imag*ca->imag;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval > tmp){dval = tmp; *ind = i;}
      }
    else
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval < tmp){dval = tmp; *ind = i;}
      }

    info->v.dval = dval; /* use abs value  for comparison*/
    info->extra = ((DoubleComplex*)ptr)[*ind]; /* append the actual val */
    break;

    case C_SCPL:
       cfa = (SingleComplex*)ptr;
       fval=cfa->real*cfa->real + cfa->imag*cfa->imag;
       if (strncmp(op,"min",3) == 0)
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval > tmp){fval = tmp; *ind = i;}
          }
       else
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval < tmp){fval = tmp; *ind = i;}
          }

       info->v.fval = fval; /* use abs value  for comparison*/
       info->extra2 = ((SingleComplex*)ptr)[*ind]; /* append the actual val */
       break;
                                                               
    case C_DBL:
    da = (double*)ptr;
    dval = *da;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(dval > da[i]) {dval=da[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(dval < da[i]) {dval=da[i];*ind=i; } }

    info->v.dval = dval; 
    break;

    case C_FLOAT:
    fa = (float*)ptr;
    fval = *fa;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(fval > fa[i]) {fval=fa[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(fval < fa[i]) {fval=fa[i];*ind=i; } }

    info->v.fval = fval;
    break;
    case C_LONG:
    la = (long*)ptr;
    lval = *la;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(lval > la[i]) {lval=la[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(lval < la[i]) {lval=la[i];*ind=i; } }

    info->v.lval = lval;
    break;
    case C_LONGLONG:
    lla = (long long*)ptr;
    llval = *lla;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(llval > lla[i]) {llval=lla[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(llval < lla[i]) {llval=lla[i];*ind=i; } }

    info->v.llval = llval;
    break;

    default: pnga_error(" wrong data type ",type);
  }
}